

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O2

void d68010_move_fr_ccr(m68k_info *info)

{
  cs_m68k *pcVar1;
  
  if ((info->type & 0x1e) != 0) {
    pcVar1 = build_init_op(info,0x119,2,2);
    pcVar1->operands[0].address_mode = M68K_AM_NONE;
    pcVar1->operands[0].field_0.simm = 3.78351e-44;
    get_ea_mode_op(info,pcVar1->operands + 1,info->ir,1);
    return;
  }
  d68000_invalid(info);
  return;
}

Assistant:

static void d68010_move_fr_ccr(m68k_info *info)
{
	cs_m68k_op* op0;
	cs_m68k_op* op1;
	cs_m68k* ext;

	LIMIT_CPU_TYPES(info, M68010_PLUS);

	ext = build_init_op(info, M68K_INS_MOVE, 2, 2);

	op0 = &ext->operands[0];
	op1 = &ext->operands[1];

	op0->address_mode = M68K_AM_NONE;
	op0->reg = M68K_REG_CCR;

	get_ea_mode_op(info, op1, info->ir, 1);
}